

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::disconnectDelegate
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  long in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  QAbstractItemView *q;
  Object *in_stack_ffffffffffffff88;
  offset_in_QAbstractItemView_to_subr in_stack_ffffffffffffffb0;
  Function slot;
  offset_in_QAbstractItemDelegate_to_subr in_stack_ffffffffffffffc0;
  offset_in_QAbstractItemDelegate_to_subr signal;
  
  if (in_RSI != 0) {
    q_func(in_RDI);
    QObject::
    disconnect<void(QAbstractItemDelegate::*)(QWidget*,QAbstractItemDelegate::EndEditHint),void(QAbstractItemView::*)(QWidget*,QAbstractItemDelegate::EndEditHint)>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffffc0,(Object *)in_RDI,
               in_stack_ffffffffffffffb0);
    signal = 0;
    slot = 0;
    QObject::
    disconnect<void(QAbstractItemDelegate::*)(QWidget*),void(QAbstractItemView::*)(QWidget*)>
              (in_stack_ffffffffffffff88,0,(Object *)in_RDI,0);
    QObjectPrivate::
    disconnect<void(QAbstractItemDelegate::*)(QModelIndex_const&),void(QAbstractItemViewPrivate::*)(QModelIndex_const&)>
              ((Object *)delegateSizeHintChanged,signal,in_RDI,slot);
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::disconnectDelegate(QAbstractItemDelegate *delegate)
{
    if (!delegate)
        return;
    Q_Q(QAbstractItemView);
    QObject::disconnect(delegate, &QAbstractItemDelegate::closeEditor,
                        q, &QAbstractItemView::closeEditor);
    QObject::disconnect(delegate, &QAbstractItemDelegate::commitData,
                        q, &QAbstractItemView::commitData);
    QObjectPrivate::disconnect(delegate, &QAbstractItemDelegate::sizeHintChanged,
                               this, &QAbstractItemViewPrivate::delegateSizeHintChanged);
}